

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# producer.cpp
# Opt level: O0

void __thiscall
pcplusplus::threads::producer_threads::producer_threads
          (producer_threads *this,size_t target,size_t count,mutex *mtx,C_V *canPro,C_V *canCon,
          queue<long> *buff)

{
  time_t __seedval;
  generic_threads *in_RCX;
  queue<long> *in_RSI;
  undefined8 *in_RDI;
  size_t in_R8;
  size_t in_R9;
  failure *e;
  allocator<char> *in_stack_ffffffffffffffb0;
  C_V *in_stack_ffffffffffffffb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc0;
  mutex *in_stack_ffffffffffffffc8;
  
  generic_threads::generic_threads
            (in_RCX,in_R8,in_R9,in_stack_ffffffffffffffc8,(C_V *)in_stack_ffffffffffffffc0,
             in_stack_ffffffffffffffb8,in_RSI);
  *in_RDI = &PTR_thread_routine_0010bc48;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffc0,(char *)in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffcf);
  std::operator|(_S_out,_S_trunc);
  std::ofstream::open((char *)(in_RDI + 0xc),0x1080e1);
  __seedval = time((time_t *)0x0);
  srand48(__seedval);
  return;
}

Assistant:

producer_threads::producer_threads(size_t target, size_t count, std::mutex *mtx, C_V *canPro, C_V *canCon, queue<long> *buff)
	: generic_threads(target, count, mtx, canPro, canCon, buff)
    {
	try{
	    logfile.open(PRODUCER_LOG_FILENAME, std::fstream::out | std::fstream::trunc);
	}
	catch(const std::ofstream::failure& e){
	    std::cerr << PRODUCER_LOG_FILENAME " could not be opened for writing" << std::endl;
	}
	srand48(std::time(nullptr));
    }